

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O3

void oonf_packet_copy_managed_config
               (oonf_packet_managed_config *dst,oonf_packet_managed_config *src)

{
  netaddr_acl_remove();
  netaddr_acl_remove(&dst->bindto);
  memcpy(dst,src,0xa0);
  (dst->acl).accept = (netaddr *)0x0;
  (dst->acl).accept_count = 0;
  (dst->acl).reject = (netaddr *)0x0;
  (dst->acl).reject_count = 0;
  (dst->acl).reject_first = false;
  (dst->acl).accept_default = false;
  *(undefined6 *)&(dst->acl).field_0x22 = 0;
  (dst->bindto).accept = (netaddr *)0x0;
  (dst->bindto).accept_count = 0;
  (dst->bindto).reject = (netaddr *)0x0;
  (dst->bindto).reject_count = 0;
  (dst->bindto).reject_first = false;
  (dst->bindto).accept_default = false;
  *(undefined6 *)&(dst->bindto).field_0x22 = 0;
  netaddr_acl_copy(dst,src);
  netaddr_acl_copy(&dst->bindto,&src->bindto);
  return;
}

Assistant:

void
oonf_packet_copy_managed_config(struct oonf_packet_managed_config *dst, const struct oonf_packet_managed_config *src) {
  oonf_packet_free_managed_config(dst);

  /* careful, we are doing a shallow copy, so both ACLs are BAD after this */
  memcpy(dst, src, sizeof(*dst));

  /* fix it to make sure we don't use-after-free or double-free */
  memset(&dst->acl, 0, sizeof(dst->acl));
  memset(&dst->bindto, 0, sizeof(dst->bindto));

  /* now do a deep copy of the ACLs */
  netaddr_acl_copy(&dst->acl, &src->acl);
  netaddr_acl_copy(&dst->bindto, &src->bindto);
}